

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::GetContentRegionMax(void)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar3;
  float fVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  IVar3 = (pIVar1->ContentRegionRect).Max;
  fVar2 = IVar3.x;
  IVar3.y = IVar3.y - (pIVar1->Pos).y;
  if ((pIVar1->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    fVar2 = (pIVar1->WorkRect).Max.x;
  }
  IVar3.x = fVar2 - (pIVar1->Pos).x;
  return IVar3;
}

Assistant:

ImVec2 ImGui::GetContentRegionMax()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImVec2 mx = window->ContentRegionRect.Max - window->Pos;
    if (window->DC.CurrentColumns)
        mx.x = window->WorkRect.Max.x - window->Pos.x;
    return mx;
}